

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_Parse_sh_wsh_miniscript_derive_Test::TestBody
          (Descriptor_Parse_sh_wsh_miniscript_derive_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_6;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list2;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list;
  AssertionResult gtest_ar_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list1;
  AssertionResult gtest_ar;
  string descriptor;
  string desc_str;
  Script locking_script;
  Script gen_script;
  Descriptor desc;
  
  std::__cxx11::string::string
            ((string *)&descriptor,
             "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))"
             ,(allocator *)&gtest_ar);
  cfd::core::Descriptor::Descriptor(&desc);
  cfd::core::Script::Script(&locking_script);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&desc_str,"",(allocator *)&gtest_ar);
  cfd::core::Script::Script(&gen_script);
  script_list.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  script_list.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  script_list.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  script_list2.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  script_list2.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  script_list2.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar,&descriptor,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=(&desc,(Descriptor *)&gtest_ar);
  cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&gtest_ar);
  arg_list1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_list1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_list1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg_list2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_list2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_list2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&gtest_ar,"0",(allocator *)&gtest_ar_1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg_list1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string((string *)&gtest_ar,"44",(allocator *)&gtest_ar_1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg_list2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                ((Descriptor *)&gtest_ar,&descriptor,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=(&desc,(Descriptor *)&gtest_ar);
      cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x32f,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Descriptor::GetLockingScript((Script *)&gtest_ar,&desc);
    cfd::core::Script::operator=(&locking_script,(Script *)&gtest_ar);
    cfd::core::Script::~Script((Script *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
             ,0x330,
             "Expected: locking_script = desc.GetLockingScript() throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_((string *)&gtest_ar,&desc,false);
      std::__cxx11::string::operator=((string *)&desc_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x331,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                ((Script *)&gtest_ar,&desc,
                 arg_list1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cfd::core::Script::operator=(&locking_script,(Script *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x332,
               "Expected: locking_script = desc.GetLockingScript(arg_list1[0]) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript((Script *)&gtest_ar,&desc,&arg_list2);
      cfd::core::Script::operator=(&gen_script,(Script *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x333,
               "Expected: gen_script = desc.GetLockingScript(arg_list2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                ((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)&gtest_ar,&desc,&arg_list1);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::_M_move_assign(&script_list,&gtest_ar);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                 *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x334,
               "Expected: script_list = desc.GetReferenceAll(&arg_list1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                ((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)&gtest_ar,&desc,&arg_list2);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::_M_move_assign(&script_list2,&gtest_ar);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                 *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x335,
               "Expected: script_list2 = desc.GetReferenceAll(&arg_list2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"desc_str.c_str()","descriptor.c_str()",desc_str._M_dataplus._M_p
             ,descriptor._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x336,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar,&locking_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"locking_script.ToString().c_str()",
             "\"OP_HASH160 a5257435d9c28329c8b8ab810f8813d347eddd17 OP_EQUAL\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "OP_HASH160 a5257435d9c28329c8b8ab810f8813d347eddd17 OP_EQUAL");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x338,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar,&gen_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"gen_script.ToString().c_str()",
             "\"OP_HASH160 a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa691 OP_EQUAL\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "OP_HASH160 a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa691 OP_EQUAL");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x33a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1._0_8_ =
       ((long)script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)script_list.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x350;
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"script_list.size()","1",(unsigned_long *)&gtest_ar_1,
             (int *)&gtest_ar_4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x33c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)script_list.
            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)script_list.
            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x350) {
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,(Address *)&gtest_ar);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,
               "script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"3GkEHYNEauSenEsqmnhjb9HGgb5pt4oaDm\"",(char *)gtest_ar_1._0_8_,
               "3GkEHYNEauSenEsqmnhjb9HGgb5pt4oaDm");
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    cfd::core::Address::~Address((Address *)&gtest_ar);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x33f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::DescriptorScriptReference::GetRedeemScript
              ((Script *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar_1,(Script *)&gtest_ar);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"script_list[0].GetRedeemScript().ToString().c_str()",
               "\"0 ac9239e9359aaed6ef6c208ae6893ee0fabb5bb0a4775c0883902367a56eec58\"",
               (char *)gtest_ar_1._0_8_,
               "0 ac9239e9359aaed6ef6c208ae6893ee0fabb5bb0a4775c0883902367a56eec58");
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    cfd::core::Script::~Script((Script *)&gtest_ar);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x341,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&gtest_ar_1,(DescriptorScriptReference *)&gtest_ar,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_4,(Address *)&gtest_ar_1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_6,
               "script_list[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"bc1q4jfrn6f4n2hddmmvyz9wdzf7uratkkas53m4czyrjq3k0ftwa3vqvjzukn\"",
               (char *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_),
               "bc1q4jfrn6f4n2hddmmvyz9wdzf7uratkkas53m4czyrjq3k0ftwa3vqvjzukn");
    std::__cxx11::string::~string((string *)&gtest_ar_4);
    cfd::core::Address::~Address((Address *)&gtest_ar_1);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x343,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::DescriptorScriptReference::GetRedeemScript
              ((Script *)&gtest_ar_1,(DescriptorScriptReference *)&gtest_ar);
    cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar_4,(Script *)&gtest_ar_1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_6,
               "script_list[0].GetChild().GetRedeemScript().ToString().c_str()",
               "\"OP_IF OP_DUP OP_HASH160 7620e8418ab0d9835cbce5316bb9c8cbfbb82726 OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 4de5a5faaee2ab254f2f042503acada802dd9714 OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG\""
               ,(char *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_),
               "OP_IF OP_DUP OP_HASH160 7620e8418ab0d9835cbce5316bb9c8cbfbb82726 OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 4de5a5faaee2ab254f2f042503acada802dd9714 OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG"
              );
    std::__cxx11::string::~string((string *)&gtest_ar_4);
    cfd::core::Script::~Script((Script *)&gtest_ar_1);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x345,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
  }
  gtest_ar_1._0_8_ =
       ((long)script_list2.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)script_list2.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x350;
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"script_list2.size()","1",(unsigned_long *)&gtest_ar_1,
             (int *)&gtest_ar_4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x348,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)script_list2.
            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)script_list2.
            super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x350) {
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&gtest_ar,
               script_list2.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,(Address *)&gtest_ar);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,
               "script_list2[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt\"",(char *)gtest_ar_1._0_8_,
               "3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt");
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    cfd::core::Address::~Address((Address *)&gtest_ar);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x34b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::DescriptorScriptReference::GetRedeemScript
              ((Script *)&gtest_ar,
               script_list2.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar_1,(Script *)&gtest_ar);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"script_list2[0].GetRedeemScript().ToString().c_str()",
               "\"0 e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa\"",
               (char *)gtest_ar_1._0_8_,
               "0 e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa");
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    cfd::core::Script::~Script((Script *)&gtest_ar);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x34d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list2.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&gtest_ar_1,(DescriptorScriptReference *)&gtest_ar,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_4,(Address *)&gtest_ar_1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_6,
               "script_list2[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh\"",
               (char *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_),
               "bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh");
    std::__cxx11::string::~string((string *)&gtest_ar_4);
    cfd::core::Address::~Address((Address *)&gtest_ar_1);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x34f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
    cfd::core::DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)&gtest_ar,
               script_list2.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::DescriptorScriptReference::GetRedeemScript
              ((Script *)&gtest_ar_1,(DescriptorScriptReference *)&gtest_ar);
    cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar_4,(Script *)&gtest_ar_1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_6,
               "script_list2[0].GetChild().GetRedeemScript().ToString().c_str()",
               "\"OP_IF OP_DUP OP_HASH160 520e6e72bcd5b616bc744092139bd759c31d6bbe OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 5ab62f0be26fe9d6205a155403f33e2ad2d31efe OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG\""
               ,(char *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_),
               "OP_IF OP_DUP OP_HASH160 520e6e72bcd5b616bc744092139bd759c31d6bbe OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 5ab62f0be26fe9d6205a155403f33e2ad2d31efe OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG"
              );
    std::__cxx11::string::~string((string *)&gtest_ar_4);
    cfd::core::Script::~Script((Script *)&gtest_ar_1);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&gtest_ar);
    if (gtest_ar_6.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_6.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x351,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_6.message_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_list2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_list1);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&script_list2);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&script_list);
  cfd::core::Script::~Script(&gen_script);
  std::__cxx11::string::~string((string *)&desc_str);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  std::__cxx11::string::~string((string *)&descriptor);
  return;
}

Assistant:

TEST(Descriptor, Parse_sh_wsh_miniscript_derive) {
  std::string descriptor = "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;
  std::vector<DescriptorScriptReference> script_list2;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  std::vector<std::string> arg_list2;
  arg_list1.push_back("0");
  arg_list2.push_back("44");
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_THROW(locking_script = desc.GetLockingScript(), CfdException);
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript(arg_list1[0]));
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript(arg_list2));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(&arg_list1));
  EXPECT_NO_THROW(script_list2 = desc.GetReferenceAll(&arg_list2));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "OP_HASH160 a5257435d9c28329c8b8ab810f8813d347eddd17 OP_EQUAL");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "OP_HASH160 a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa691 OP_EQUAL");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "3GkEHYNEauSenEsqmnhjb9HGgb5pt4oaDm");
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "0 ac9239e9359aaed6ef6c208ae6893ee0fabb5bb0a4775c0883902367a56eec58");
    EXPECT_STREQ(script_list[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1q4jfrn6f4n2hddmmvyz9wdzf7uratkkas53m4czyrjq3k0ftwa3vqvjzukn");
    EXPECT_STREQ(script_list[0].GetChild().GetRedeemScript().ToString().c_str(),
      "OP_IF OP_DUP OP_HASH160 7620e8418ab0d9835cbce5316bb9c8cbfbb82726 OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 4de5a5faaee2ab254f2f042503acada802dd9714 OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG");
  }

  EXPECT_EQ(script_list2.size(), 1);
  if (script_list2.size() == 1) {
    EXPECT_STREQ(script_list2[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt");
    EXPECT_STREQ(script_list2[0].GetRedeemScript().ToString().c_str(),
      "0 e29b7f3e543d581c99c92b59d45218b008b82c2d406bba3c7384d52e568124aa");
    EXPECT_STREQ(script_list2[0].GetChild().GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1qu2dh70j584vpexwf9dvag5sckqytstpdgp4m50rnsn2ju45pyj4qudazmh");
    EXPECT_STREQ(script_list2[0].GetChild().GetRedeemScript().ToString().c_str(),
      "OP_IF OP_DUP OP_HASH160 520e6e72bcd5b616bc744092139bd759c31d6bbe OP_EQUALVERIFY OP_CHECKSIG OP_NOTIF OP_DUP OP_HASH160 06afd46bcdfd22ef94ac122aa11f241244a37ecc OP_EQUALVERIFY OP_ELSE OP_DUP OP_HASH160 5ab62f0be26fe9d6205a155403f33e2ad2d31efe OP_EQUALVERIFY OP_ENDIF OP_ELSE 02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e OP_ENDIF OP_CHECKSIG");
  }
}